

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined8 *)&this->super_IfcConstructionResource = 0x81a990;
  *(undefined8 *)&this->field_0x1c8 = 0x81aa80;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x81a9b8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x81a9e0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x81aa08;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x81aa30;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x81aa58;
  pcVar2 = (this->JobDescription).ptr._M_dataplus._M_p;
  paVar1 = &(this->JobDescription).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x190 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x190);
  }
  IfcConstructionResource::~IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__0081aa98);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}